

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

char * JS_ToCStringLen2(JSContext *ctx,size_t *plen,JSValue val1,BOOL cesu8)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  JSString *pJVar5;
  ulong uVar6;
  JSString *pJVar7;
  JSString *buf;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint16_t *src;
  JSString *pJVar12;
  
  if ((int)val1.tag != -7) {
    val1 = JS_ToString(ctx,val1);
    if ((int)val1.tag != 6) goto LAB_00116955;
LAB_00116aaf:
    uVar6 = 0;
    pJVar12 = (JSString *)0x0;
    if (plen == (size_t *)0x0) {
      return (char *)0x0;
    }
    goto LAB_00116b13;
  }
  *(int *)val1.u.ptr = *val1.u.ptr + 1;
LAB_00116955:
  uVar10 = (uint)*(undefined8 *)((long)val1.u.ptr + 4);
  uVar11 = uVar10 & 0x7fffffff;
  pJVar12 = (JSString *)((long)val1.u.ptr + 0x10);
  if ((int)uVar10 < 0) {
    pJVar5 = js_alloc_string(ctx,uVar11 * 3,0);
    if (pJVar5 == (JSString *)0x0) goto LAB_00116aaf;
    buf = pJVar5 + 1;
    iVar9 = 0;
    while (iVar9 < (int)uVar11) {
      iVar4 = iVar9 + 1;
      uVar2 = *(ushort *)((long)&(pJVar12->header).ref_count + (long)iVar9 * 2);
      uVar10 = (uint)uVar2;
      if (uVar2 < 0x80) {
        *(char *)&(buf->header).ref_count = (char)uVar2;
        buf = (JSString *)((long)&(buf->header).ref_count + 1);
        iVar9 = iVar4;
      }
      else {
        if (((((uVar2 & 0xfc00) == 0xd800) && (cesu8 == 0)) && (iVar4 < (int)uVar11)) &&
           (uVar3 = *(ushort *)((long)&(pJVar12->header).ref_count + (long)iVar4 * 2),
           (uVar3 & 0xfc00) == 0xdc00)) {
          uVar10 = (uVar2 & 0x3ff) * 0x400 + (uVar3 & 0x3ff) + 0x10000;
          iVar4 = iVar9 + 2;
        }
        iVar9 = iVar4;
        iVar4 = unicode_to_utf8((uint8_t *)buf,uVar10);
        buf = (JSString *)((long)&(buf->header).ref_count + (long)iVar4);
      }
    }
LAB_00116ac8:
    *(undefined1 *)&(buf->header).ref_count = 0;
    pJVar12 = pJVar5 + 1;
    *(ulong *)&pJVar5->field_0x4 =
         *(ulong *)&pJVar5->field_0x4 & 0xffffffff80000000 |
         (ulong)((int)buf - (int)pJVar12 & 0x7fffffff);
    JS_FreeValue(ctx,val1);
    if (plen == (size_t *)0x0) {
      return (char *)pJVar12;
    }
    uVar10 = (uint)*(undefined8 *)&pJVar5->field_0x4;
  }
  else {
    iVar9 = 0;
    for (uVar6 = 0; (uVar10 & 0x7fffffff) != uVar6; uVar6 = uVar6 + 1) {
      iVar9 = iVar9 + (uint)(*(byte *)((long)&(pJVar12->header).ref_count + uVar6) >> 7);
    }
    if (iVar9 != 0) {
      pJVar5 = js_alloc_string(ctx,iVar9 + uVar11,0);
      if (pJVar5 == (JSString *)0x0) goto LAB_00116aaf;
      buf = pJVar5 + 1;
      for (uVar6 = 0; (uVar10 & 0x7fffffff) != uVar6; uVar6 = uVar6 + 1) {
        bVar1 = *(byte *)((long)&(pJVar12->header).ref_count + uVar6);
        if ((char)bVar1 < '\0') {
          bVar8 = bVar1 >> 6 | 0xc0;
          pJVar7 = (JSString *)((long)&(buf->header).ref_count + 2);
          *(byte *)((long)&(buf->header).ref_count + 1) = bVar1 & 0xbf;
        }
        else {
          pJVar7 = (JSString *)((long)&(buf->header).ref_count + 1);
          bVar8 = bVar1;
        }
        *(byte *)&(buf->header).ref_count = bVar8;
        buf = pJVar7;
      }
      goto LAB_00116ac8;
    }
    if (plen == (size_t *)0x0) {
      return (char *)pJVar12;
    }
  }
  uVar6 = (ulong)(uVar10 & 0x7fffffff);
LAB_00116b13:
  *plen = uVar6;
  return (char *)pJVar12;
}

Assistant:

const char *JS_ToCStringLen2(JSContext *ctx, size_t *plen, JSValueConst val1, BOOL cesu8)
{
    JSValue val;
    JSString *str, *str_new;
    int pos, len, c, c1;
    uint8_t *q;

    if (JS_VALUE_GET_TAG(val1) != JS_TAG_STRING) {
        val = JS_ToString(ctx, val1);
        if (JS_IsException(val))
            goto fail;
    } else {
        val = JS_DupValue(ctx, val1);
    }

    str = JS_VALUE_GET_STRING(val);
    len = str->len;
    if (!str->is_wide_char) {
        const uint8_t *src = str->u.str8;
        int count;

        /* count the number of non-ASCII characters */
        /* Scanning the whole string is required for ASCII strings,
           and computing the number of non-ASCII bytes is less expensive
           than testing each byte, hence this method is faster for ASCII
           strings, which is the most common case.
         */
        count = 0;
        for (pos = 0; pos < len; pos++) {
            count += src[pos] >> 7;
        }
        if (count == 0) {
            if (plen)
                *plen = len;
            return (const char *)src;
        }
        str_new = js_alloc_string(ctx, len + count, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        for (pos = 0; pos < len; pos++) {
            c = src[pos];
            if (c < 0x80) {
                *q++ = c;
            } else {
                *q++ = (c >> 6) | 0xc0;
                *q++ = (c & 0x3f) | 0x80;
            }
        }
    } else {
        const uint16_t *src = str->u.str16;
        /* Allocate 3 bytes per 16 bit code point. Surrogate pairs may
           produce 4 bytes but use 2 code points.
         */
        str_new = js_alloc_string(ctx, len * 3, 0);
        if (!str_new)
            goto fail;
        q = str_new->u.str8;
        pos = 0;
        while (pos < len) {
            c = src[pos++];
            if (c < 0x80) {
                *q++ = c;
            } else {
                if (c >= 0xd800 && c < 0xdc00) {
                    if (pos < len && !cesu8) {
                        c1 = src[pos];
                        if (c1 >= 0xdc00 && c1 < 0xe000) {
                            pos++;
                            /* surrogate pair */
                            c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
                        } else {
                            /* Keep unmatched surrogate code points */
                            /* c = 0xfffd; */ /* error */
                        }
                    } else {
                        /* Keep unmatched surrogate code points */
                        /* c = 0xfffd; */ /* error */
                    }
                }
                q += unicode_to_utf8(q, c);
            }
        }
    }

    *q = '\0';
    str_new->len = q - str_new->u.str8;
    JS_FreeValue(ctx, val);
    if (plen)
        *plen = str_new->len;
    return (const char *)str_new->u.str8;
 fail:
    if (plen)
        *plen = 0;
    return NULL;
}